

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

PerspectiveCamera * __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
new_object<pbrt::PerspectiveCamera,pbrt::CameraBaseParameters&,float&,pbrt::Bounds2<float>&,float&,float&>
          (polymorphic_allocator<std::byte> *this,CameraBaseParameters *args,float *args_1,
          Bounds2<float> *args_2,float *args_3,float *args_4)

{
  PerspectiveCamera *pPVar1;
  polymorphic_allocator<std::byte> *in_RDI;
  PerspectiveCamera *p;
  float *in_stack_00000308;
  Bounds2<float> *in_stack_00000310;
  float *in_stack_00000318;
  CameraBaseParameters *in_stack_00000320;
  PerspectiveCamera *in_stack_00000328;
  polymorphic_allocator<std::byte> *in_stack_00000330;
  float *in_stack_00000340;
  size_t in_stack_ffffffffffffffb8;
  
  pPVar1 = allocate_object<pbrt::PerspectiveCamera>(in_RDI,in_stack_ffffffffffffffb8);
  construct<pbrt::PerspectiveCamera,pbrt::CameraBaseParameters&,float&,pbrt::Bounds2<float>&,float&,float&>
            (in_stack_00000330,in_stack_00000328,in_stack_00000320,in_stack_00000318,
             in_stack_00000310,in_stack_00000308,in_stack_00000340);
  return pPVar1;
}

Assistant:

T *new_object(Args &&... args) {
        // NOTE: this doesn't handle constructors that throw exceptions...
        T *p = allocate_object<T>();
        construct(p, std::forward<Args>(args)...);
        return p;
    }